

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_nodesel.cc
# Opt level: O0

RC __thiscall QL_NodeSel::SetUpNode(QL_NodeSel *this,int numConds)

{
  int *piVar1;
  Cond *pCVar2;
  char *pcVar3;
  undefined4 local_60 [2];
  undefined8 local_58;
  undefined1 local_50;
  undefined8 local_48;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  int local_30;
  int local_2c;
  int i_1;
  int i;
  int *attrListPtr;
  RC rc;
  int numConds_local;
  QL_NodeSel *this_local;
  
  attrListPtr._0_4_ = 0;
  attrListPtr._4_4_ = numConds;
  _rc = this;
  attrListPtr._0_4_ =
       QL_Node::GetAttrList(this->prevNode,(int **)&i_1,&(this->super_QL_Node).attrsInRecSize);
  this_local._4_4_ = (RC)attrListPtr;
  if ((RC)attrListPtr == 0) {
    piVar1 = (int *)malloc((long)(this->super_QL_Node).attrsInRecSize << 2);
    (this->super_QL_Node).attrsInRec = piVar1;
    for (local_2c = 0; local_2c < (this->super_QL_Node).attrsInRecSize; local_2c = local_2c + 1) {
      (this->super_QL_Node).attrsInRec[local_2c] = _i_1[local_2c];
    }
    pCVar2 = (Cond *)malloc((long)attrListPtr._4_4_ * 0x30);
    (this->super_QL_Node).condList = pCVar2;
    for (local_30 = 0; local_30 < attrListPtr._4_4_; local_30 = local_30 + 1) {
      local_60[0] = 0;
      local_58 = 0;
      local_50 = 1;
      local_48 = 0;
      local_40 = 0;
      local_3c = 0;
      local_38 = 0;
      local_34 = 0;
      memcpy((this->super_QL_Node).condList + local_30,local_60,0x30);
    }
    piVar1 = (int *)malloc((long)attrListPtr._4_4_ << 2);
    (this->super_QL_Node).condsInNode = piVar1;
    memset((this->super_QL_Node).condsInNode,0,8);
    QL_Node::GetTupleLength(this->prevNode,&(this->super_QL_Node).tupleLength);
    pcVar3 = (char *)malloc((long)(this->super_QL_Node).tupleLength);
    this->buffer = pcVar3;
    memset(this->buffer,0,8);
    (this->super_QL_Node).listsInitialized = true;
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

RC QL_NodeSel::SetUpNode(int numConds){
  RC rc = 0;
  int *attrListPtr;
  if((rc = prevNode.GetAttrList(attrListPtr, attrsInRecSize)))
    return (rc);
  attrsInRec = (int *)malloc(attrsInRecSize*sizeof(int));
  for(int i = 0;  i < attrsInRecSize; i++){
    attrsInRec[i] = attrListPtr[i];
  }

  // allot space for these conditions
  condList = (Cond *)malloc(numConds * sizeof(Cond));
  for(int i= 0; i < numConds; i++){
    condList[i] = {0, NULL, true, NULL, 0, 0, INT};
  }
  condsInNode = (int*)malloc(numConds * sizeof(int));
  memset((void*)condsInNode, 0, sizeof(condsInNode));

  prevNode.GetTupleLength(tupleLength);
  buffer = (char *)malloc(tupleLength); // set up buffer
  memset((void*)buffer, 0, sizeof(buffer));
  listsInitialized = true;
  return (0);
}